

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::createUnaryOperation
          (TGlslangToSpvTraverser *this,TOperator op,OpDecorations *decorations,Id typeId,Id operand
          ,TBasicType typeProxy,CoherentFlags *lvalueCoherentFlags,TType *opType)

{
  set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_> *this_00;
  bool bVar1;
  Id IVar2;
  Builder *this_01;
  Op opCode;
  int iVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  TType *in_stack_ffffffffffffffa0;
  Id local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  IVar2 = 0;
  local_4c = operand;
  if (0x249 < (int)op) {
    if (0x2e1 < (int)op) {
      switch(op) {
      case EOpHitObjectGetSpherePositionNV:
        opCode = OpHitObjectGetSpherePositionNV;
        break;
      case EOpHitObjectGetSphereRadiusNV:
        opCode = OpHitObjectGetSphereRadiusNV;
        break;
      case EOpHitObjectGetLSSPositionsNV:
      case EOpHitObjectGetLSSRadiiNV:
        goto switchD_003c19b6_caseD_c;
      case EOpHitObjectIsSphereHitNV:
        opCode = OpHitObjectIsSphereHitNV;
        break;
      case EOpHitObjectIsLSSHitNV:
        opCode = OpHitObjectIsLSSHitNV;
        break;
      default:
        if (op == EOpDepthAttachmentReadEXT) {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x1047);
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&(this->builder).capabilities,(Capability *)&local_48);
          decorations->precision = DecorationMax;
          opCode = OpDepthAttachmentReadEXT;
        }
        else {
          if (op != EOpHitObjectGetClusterIdNV) {
            return 0;
          }
          spv::Builder::addExtension(&this->builder,"SPV_NV_cluster_acceleration_structure");
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x1507;
          this_00 = &(this->builder).capabilities;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)this_00,(Capability *)&local_48);
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x153d);
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)this_00,(Capability *)&local_48);
          opCode = OpHitObjectGetClusterIdNV;
        }
      }
      goto LAB_003c24d0;
    }
    IVar2 = 0;
    switch(op) {
    case EOpBitFieldReverse:
      opCode = OpBitReverse;
      break;
    case EOpBitCount:
      opCode = OpBitCount;
      break;
    case EOpFindLSB:
      iVar3 = 0x49;
      goto LAB_003c1ecc;
    case EOpFindMSB:
      iVar3 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + 0x4a;
LAB_003c1ecc:
      opCode = OpNop;
      IVar2 = 0xffffffff;
      bVar1 = true;
      goto LAB_003c24d9;
    case EOpCountLeadingZeros:
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x15d0);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_48);
      spv::Builder::addExtension(&this->builder,"SPV_INTEL_shader_integer_functions2");
      opCode = OpUCountLeadingZerosINTEL;
      break;
    case EOpCountTrailingZeros:
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x15d0);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_48);
      spv::Builder::addExtension(&this->builder,"SPV_INTEL_shader_integer_functions2");
      opCode = OpUCountTrailingZerosINTEL;
      break;
    case EOpAbsDifference:
    case EOpAddSaturate:
    case EOpSubSaturate:
    case EOpAverage:
    case EOpAverageRounded:
    case EOpMul32x16:
    case EOpTraceNV:
    case EOpTraceRayMotionNV:
    case EOpTraceKHR:
    case EOpReportIntersection:
    case EOpIgnoreIntersectionNV:
    case EOpTerminateRayNV:
    case EOpExecuteCallableNV:
    case EOpExecuteCallableKHR:
    case EOpWritePackedPrimitiveIndices4x8NV:
    case EOpEmitMeshTasksEXT:
    case EOpSetMeshOutputsEXT:
    case EOpRayQueryInitialize:
    case EOpRayQueryTerminate:
    case EOpRayQueryGenerateIntersection:
    case EOpRayQueryConfirmIntersection:
    case EOpRayQueryGetIntersectionType:
    case EOpRayQueryGetIntersectionT:
    case EOpRayQueryGetIntersectionInstanceCustomIndex:
    case EOpRayQueryGetIntersectionInstanceId:
    case EOpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffset:
    case EOpRayQueryGetIntersectionGeometryIndex:
    case EOpRayQueryGetIntersectionPrimitiveIndex:
    case EOpRayQueryGetIntersectionBarycentrics:
    case EOpRayQueryGetIntersectionFrontFace:
    case EOpRayQueryGetIntersectionObjectRayDirection:
    case EOpRayQueryGetIntersectionObjectRayOrigin:
    case EOpRayQueryGetIntersectionObjectToWorld:
    case EOpRayQueryGetIntersectionWorldToObject:
    case EOpHitObjectTraceRayNV:
    case EOpHitObjectTraceRayMotionNV:
    case EOpHitObjectRecordHitNV:
    case EOpHitObjectRecordHitMotionNV:
    case EOpHitObjectRecordHitWithIndexNV:
    case EOpHitObjectRecordHitWithIndexMotionNV:
    case EOpHitObjectRecordMissNV:
    case EOpHitObjectRecordMissMotionNV:
    case EOpHitObjectRecordEmptyNV:
    case EOpHitObjectExecuteShaderNV:
    case EOpHitObjectGetAttributesNV:
    case EOpReorderThreadNV:
    case EOpClip:
      goto switchD_003c19b6_caseD_c;
    case EOpRayQueryProceed:
      opCode = OpRayQueryProceedKHR;
      break;
    case EOpRayQueryGetRayTMin:
      opCode = OpRayQueryGetRayTMinKHR;
      break;
    case EOpRayQueryGetRayFlags:
      opCode = OpRayQueryGetRayFlagsKHR;
      break;
    case EOpRayQueryGetIntersectionCandidateAABBOpaque:
      opCode = OpRayQueryGetIntersectionCandidateAABBOpaqueKHR;
      break;
    case EOpRayQueryGetWorldRayDirection:
      opCode = OpRayQueryGetWorldRayDirectionKHR;
      break;
    case EOpRayQueryGetWorldRayOrigin:
      opCode = OpRayQueryGetWorldRayOriginKHR;
      break;
    case EOpHitObjectIsEmptyNV:
      opCode = OpHitObjectIsEmptyNV;
      break;
    case EOpHitObjectIsMissNV:
      opCode = OpHitObjectIsMissNV;
      break;
    case EOpHitObjectIsHitNV:
      opCode = OpHitObjectIsHitNV;
      break;
    case EOpHitObjectGetRayTMinNV:
      opCode = OpHitObjectGetRayTMinNV;
      break;
    case EOpHitObjectGetRayTMaxNV:
      opCode = OpHitObjectGetRayTMaxNV;
      break;
    case EOpHitObjectGetObjectRayOriginNV:
      opCode = OpHitObjectGetObjectRayOriginNV;
      break;
    case EOpHitObjectGetObjectRayDirectionNV:
      opCode = OpHitObjectGetObjectRayDirectionNV;
      break;
    case EOpHitObjectGetWorldRayOriginNV:
      opCode = OpHitObjectGetWorldRayOriginNV;
      break;
    case EOpHitObjectGetWorldRayDirectionNV:
      opCode = OpHitObjectGetWorldRayDirectionNV;
      break;
    case EOpHitObjectGetWorldToObjectNV:
      opCode = OpHitObjectGetWorldToObjectNV;
      break;
    case EOpHitObjectGetObjectToWorldNV:
      opCode = OpHitObjectGetObjectToWorldNV;
      break;
    case EOpHitObjectGetInstanceCustomIndexNV:
      opCode = OpHitObjectGetInstanceCustomIndexNV;
      break;
    case EOpHitObjectGetInstanceIdNV:
      opCode = OpHitObjectGetInstanceIdNV;
      break;
    case EOpHitObjectGetGeometryIndexNV:
      opCode = OpHitObjectGetGeometryIndexNV;
      break;
    case EOpHitObjectGetPrimitiveIndexNV:
      opCode = OpHitObjectGetPrimitiveIndexNV;
      break;
    case EOpHitObjectGetHitKindNV:
      opCode = OpHitObjectGetHitKindNV;
      break;
    case EOpHitObjectGetShaderBindingTableRecordIndexNV:
      opCode = OpHitObjectGetShaderBindingTableRecordIndexNV;
      break;
    case EOpHitObjectGetShaderRecordBufferHandleNV:
      opCode = OpHitObjectGetShaderRecordBufferHandleNV;
      break;
    case EOpHitObjectGetCurrentTimeNV:
      opCode = OpHitObjectGetCurrentTimeNV;
      break;
    case EOpFetchMicroTriangleVertexPositionNV:
      opCode = OpFetchMicroTriangleVertexPositionNV;
      break;
    case EOpFetchMicroTriangleVertexBarycentricNV:
      opCode = OpFetchMicroTriangleVertexBarycentricNV;
      break;
    case EOpIsFinite:
      opCode = OpIsFinite;
      break;
    default:
      if (op != EOpStencilAttachmentReadEXT) {
        return 0;
      }
      spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x1048);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_48);
      decorations->precision = DecorationRelaxedPrecision;
      opCode = OpStencilAttachmentReadEXT;
    }
LAB_003c24d0:
    IVar2 = 0xffffffff;
    bVar1 = false;
    iVar3 = -1;
    goto LAB_003c24d9;
  }
  if (0x13d < op - EOpNegative) {
    if (op != EOpConstructReference) {
      return 0;
    }
    opCode = OpBitcast;
    goto LAB_003c24d0;
  }
  IVar2 = 0;
  switch(op) {
  case EOpNegative:
    if (typeProxy - EbtFloat < 3) {
      if ((this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode == OpTypeMatrix) {
        IVar2 = createUnaryMatrixOperation(this,OpFNegate,decorations,typeId,operand,typeId);
        return IVar2;
      }
      opCode = OpFNegate;
    }
    else {
      opCode = OpSNegate;
    }
    goto LAB_003c24d0;
  case EOpLogicalNot:
  case EOpVectorLogicalNot:
    opCode = OpLogicalNot;
    goto LAB_003c1a38;
  case EOpBitwiseNot:
    opCode = OpNot;
    goto LAB_003c1a38;
  default:
    goto switchD_003c19b6_caseD_c;
  case EOpCopyObject:
    opCode = OpCopyObject;
    goto LAB_003c1a38;
  case EOpConvUint64ToAccStruct:
  case EOpConvUvec2ToAccStruct:
    opCode = OpConvertUToAccelerationStructureKHR;
    goto LAB_003c1a38;
  case EOpRadians:
    IVar2 = 0xffffffff;
    iVar3 = 0xb;
    break;
  case EOpDegrees:
    IVar2 = 0xffffffff;
    iVar3 = 0xc;
    break;
  case EOpSin:
    IVar2 = 0xffffffff;
    iVar3 = 0xd;
    break;
  case EOpCos:
    IVar2 = 0xffffffff;
    iVar3 = 0xe;
    break;
  case EOpTan:
    IVar2 = 0xffffffff;
    iVar3 = 0xf;
    break;
  case EOpAsin:
    IVar2 = 0xffffffff;
    iVar3 = 0x10;
    break;
  case EOpAcos:
    IVar2 = 0xffffffff;
    iVar3 = 0x11;
    break;
  case EOpAtan:
    IVar2 = 0xffffffff;
    iVar3 = 0x12;
    break;
  case EOpSinh:
    IVar2 = 0xffffffff;
    iVar3 = 0x13;
    break;
  case EOpCosh:
    IVar2 = 0xffffffff;
    iVar3 = 0x14;
    break;
  case EOpTanh:
    IVar2 = 0xffffffff;
    iVar3 = 0x15;
    break;
  case EOpAsinh:
    IVar2 = 0xffffffff;
    iVar3 = 0x16;
    break;
  case EOpAcosh:
    IVar2 = 0xffffffff;
    iVar3 = 0x17;
    break;
  case EOpAtanh:
    IVar2 = 0xffffffff;
    iVar3 = 0x18;
    break;
  case EOpExp:
    IVar2 = 0xffffffff;
    iVar3 = 0x1b;
    break;
  case EOpLog:
    IVar2 = 0xffffffff;
    iVar3 = 0x1c;
    break;
  case EOpExp2:
    IVar2 = 0xffffffff;
    iVar3 = 0x1d;
    break;
  case EOpLog2:
    IVar2 = 0xffffffff;
    iVar3 = 0x1e;
    break;
  case EOpSqrt:
    IVar2 = 0xffffffff;
    iVar3 = 0x1f;
    break;
  case EOpInverseSqrt:
    IVar2 = 0xffffffff;
    iVar3 = 0x20;
    break;
  case EOpAbs:
    iVar3 = 5;
    goto LAB_003c22f0;
  case EOpSign:
    iVar3 = 7;
LAB_003c22f0:
    IVar2 = 0xffffffff;
    iVar3 = iVar3 - (uint)(typeProxy - EbtFloat < 3);
    break;
  case EOpFloor:
    IVar2 = 0xffffffff;
    iVar3 = 8;
    break;
  case EOpTrunc:
    IVar2 = 0xffffffff;
    iVar3 = 3;
    break;
  case EOpRound:
    IVar2 = 0xffffffff;
    goto LAB_003c23fe;
  case EOpRoundEven:
    IVar2 = 0xffffffff;
    goto LAB_003c24a6;
  case EOpCeil:
    IVar2 = 0xffffffff;
    iVar3 = 9;
    break;
  case EOpFract:
    IVar2 = 0xffffffff;
    iVar3 = 10;
    break;
  case EOpIsNan:
    opCode = OpIsNan;
    goto LAB_003c1a38;
  case EOpIsInf:
    opCode = OpIsInf;
    goto LAB_003c1a38;
  case EOpFloatBitsToInt:
  case EOpFloatBitsToUint:
  case EOpIntBitsToFloat:
  case EOpUintBitsToFloat:
  case EOpDoubleBitsToInt64:
  case EOpDoubleBitsToUint64:
  case EOpInt64BitsToDouble:
  case EOpUint64BitsToDouble:
  case EOpFloat16BitsToInt16:
  case EOpFloat16BitsToUint16:
  case EOpInt16BitsToFloat16:
  case EOpUint16BitsToFloat16:
  case EOpPackInt2x32:
  case EOpUnpackInt2x32:
  case EOpPackUint2x32:
  case EOpUnpackUint2x32:
  case EOpPackFloat2x16:
  case EOpUnpackFloat2x16:
  case EOpPackInt2x16:
  case EOpUnpackInt2x16:
  case EOpPackUint2x16:
  case EOpUnpackUint2x16:
  case EOpPackInt4x16:
  case EOpUnpackInt4x16:
  case EOpPackUint4x16:
  case EOpUnpackUint4x16:
  case EOpPack16:
  case EOpPack32:
  case EOpPack64:
  case EOpUnpack32:
  case EOpUnpack16:
  case EOpUnpack8:
    opCode = OpBitcast;
    goto LAB_003c1a38;
  case EOpPackSnorm2x16:
    IVar2 = 0xffffffff;
    iVar3 = 0x38;
    break;
  case EOpUnpackSnorm2x16:
    IVar2 = 0xffffffff;
    iVar3 = 0x3c;
    break;
  case EOpPackUnorm2x16:
    IVar2 = 0xffffffff;
    iVar3 = 0x39;
    break;
  case EOpUnpackUnorm2x16:
    IVar2 = 0xffffffff;
    iVar3 = 0x3d;
    break;
  case EOpPackSnorm4x8:
    IVar2 = 0xffffffff;
    iVar3 = 0x36;
    break;
  case EOpUnpackSnorm4x8:
    IVar2 = 0xffffffff;
    iVar3 = 0x3f;
    break;
  case EOpPackUnorm4x8:
    IVar2 = 0xffffffff;
    iVar3 = 0x37;
    break;
  case EOpUnpackUnorm4x8:
    IVar2 = 0xffffffff;
    iVar3 = 0x40;
    break;
  case EOpPackHalf2x16:
    IVar2 = 0xffffffff;
    iVar3 = 0x3a;
    break;
  case EOpUnpackHalf2x16:
    IVar2 = 0xffffffff;
    iVar3 = 0x3e;
    break;
  case EOpPackDouble2x32:
    IVar2 = 0xffffffff;
    iVar3 = 0x3b;
    break;
  case EOpUnpackDouble2x32:
    IVar2 = 0xffffffff;
    iVar3 = 0x41;
    break;
  case EOpLength:
    IVar2 = 0xffffffff;
    iVar3 = 0x42;
    break;
  case EOpNormalize:
    IVar2 = 0xffffffff;
    iVar3 = 0x45;
    break;
  case EOpDPdx:
    opCode = OpDPdx;
    goto LAB_003c1a38;
  case EOpDPdy:
    opCode = OpDPdy;
    goto LAB_003c1a38;
  case EOpFwidth:
    opCode = OpFwidth;
    goto LAB_003c1a38;
  case EOpDPdxFine:
    opCode = OpDPdxFine;
    goto LAB_003c1a38;
  case EOpDPdyFine:
    opCode = OpDPdyFine;
    goto LAB_003c1a38;
  case EOpFwidthFine:
    opCode = OpFwidthFine;
    goto LAB_003c1a38;
  case EOpDPdxCoarse:
    opCode = OpDPdxCoarse;
    goto LAB_003c1a38;
  case EOpDPdyCoarse:
    opCode = OpDPdyCoarse;
    goto LAB_003c1a38;
  case EOpFwidthCoarse:
    opCode = OpFwidthCoarse;
    goto LAB_003c1a38;
  case EOpInterpolateAtCentroid:
    IVar2 = 0xffffffff;
    opCode = OpNop;
    iVar3 = 0x4c;
    bVar1 = true;
    if (typeProxy == EbtFloat16) {
      spv::Builder::addExtension(&this->builder,"SPV_AMD_gpu_shader_half_float");
      opCode = OpNop;
    }
    goto LAB_003c24d9;
  case EOpDeterminant:
    IVar2 = 0xffffffff;
    iVar3 = 0x21;
    break;
  case EOpMatrixInverse:
    IVar2 = 0xffffffff;
    iVar3 = 0x22;
    break;
  case EOpTranspose:
    opCode = OpTranspose;
    goto LAB_003c1a38;
  case EOpBallot:
  case EOpReadFirstInvocation:
  case EOpAnyInvocation:
  case EOpAllInvocations:
  case EOpAllInvocationsEqual:
  case EOpMinInvocations:
  case EOpMaxInvocations:
  case EOpAddInvocations:
  case EOpMinInvocationsNonUniform:
  case EOpMaxInvocationsNonUniform:
  case EOpAddInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScan:
  case EOpMaxInvocationsInclusiveScan:
  case EOpAddInvocationsInclusiveScan:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
  case EOpAddInvocationsExclusiveScan:
  case EOpMinInvocationsExclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,(iterator)0x0,
               &local_4c);
    IVar2 = createInvocationsOperation(this,op,typeId,&local_48,typeProxy);
    goto LAB_003c1aca;
  case EOpSubgroupAll:
  case EOpSubgroupAny:
  case EOpSubgroupAllEqual:
  case EOpSubgroupBroadcastFirst:
  case EOpSubgroupBallot:
  case EOpSubgroupInverseBallot:
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
  case EOpSubgroupBallotFindLSB:
  case EOpSubgroupBallotFindMSB:
  case EOpSubgroupAdd:
  case EOpSubgroupMul:
  case EOpSubgroupMin:
  case EOpSubgroupMax:
  case EOpSubgroupAnd:
  case EOpSubgroupOr:
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupExclusiveXor:
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
  case EOpSubgroupQuadAll:
  case EOpSubgroupQuadAny:
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,(iterator)0x0,
               &local_4c);
    IVar2 = createSubgroupOperation(this,op,typeId,&local_48,typeProxy);
    goto LAB_003c1aca;
  case EOpSubgroupPartition:
    opCode = OpGroupNonUniformPartitionNV;
    goto LAB_003c1a38;
  case EOpMbcnt:
    IVar2 = getExtBuiltins(this,"SPV_AMD_shader_ballot");
    iVar3 = 4;
    break;
  case EOpCubeFaceIndex:
    IVar2 = getExtBuiltins(this,"SPV_AMD_gcn_shader");
LAB_003c23fe:
    iVar3 = 1;
    break;
  case EOpCubeFaceCoord:
    IVar2 = getExtBuiltins(this,"SPV_AMD_gcn_shader");
LAB_003c24a6:
    iVar3 = 2;
    break;
  case EOpAtomicCounterIncrement:
  case EOpAtomicCounterDecrement:
  case EOpAtomicCounter:
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,(iterator)0x0,
               &local_4c);
    IVar2 = createAtomicOperation
                      (this,op,typeId,(Id)&local_48,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)typeProxy,
                       (TBasicType)lvalueCoherentFlags,(CoherentFlags *)opType,
                       in_stack_ffffffffffffffa0);
LAB_003c1aca:
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return IVar2;
    }
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    return IVar2;
  case EOpAny:
    opCode = OpAny;
    goto LAB_003c1a38;
  case EOpAll:
    opCode = OpAll;
LAB_003c1a38:
    bVar1 = false;
    IVar2 = 0xffffffff;
    iVar3 = -1;
    goto LAB_003c24d9;
  }
  opCode = OpNop;
  bVar1 = true;
LAB_003c24d9:
  if (bVar1) {
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,(iterator)0x0,
               &local_4c);
    if ((int)IVar2 < 0) {
      IVar2 = this->stdBuiltins;
    }
    IVar2 = spv::Builder::createBuiltinCall(&this->builder,typeId,IVar2,iVar3,&local_48);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    IVar2 = spv::Builder::createUnaryOp(&this->builder,opCode,typeId,local_4c);
  }
  this_01 = &this->builder;
  spv::Builder::addDecoration(this_01,IVar2,decorations->noContraction,-1);
  spv::Builder::addDecoration(this_01,IVar2,decorations->nonUniform,-1);
  if (IVar2 != 0 && decorations->precision != DecorationMax) {
    spv::Builder::addDecoration(this_01,IVar2,decorations->precision,-1);
  }
switchD_003c19b6_caseD_c:
  return IVar2;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createUnaryOperation(glslang::TOperator op, OpDecorations& decorations, spv::Id typeId,
    spv::Id operand, glslang::TBasicType typeProxy, const spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags,
    const glslang::TType &opType)
{
    spv::Op unaryOp = spv::OpNop;
    int extBuiltins = -1;
    int libCall = -1;
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);

    switch (op) {
    case glslang::EOpNegative:
        if (isFloat) {
            unaryOp = spv::OpFNegate;
            if (builder.isMatrixType(typeId))
                return createUnaryMatrixOperation(unaryOp, decorations, typeId, operand, typeProxy);
        } else
            unaryOp = spv::OpSNegate;
        break;

    case glslang::EOpLogicalNot:
    case glslang::EOpVectorLogicalNot:
        unaryOp = spv::OpLogicalNot;
        break;
    case glslang::EOpBitwiseNot:
        unaryOp = spv::OpNot;
        break;

    case glslang::EOpDeterminant:
        libCall = spv::GLSLstd450Determinant;
        break;
    case glslang::EOpMatrixInverse:
        libCall = spv::GLSLstd450MatrixInverse;
        break;
    case glslang::EOpTranspose:
        unaryOp = spv::OpTranspose;
        break;

    case glslang::EOpRadians:
        libCall = spv::GLSLstd450Radians;
        break;
    case glslang::EOpDegrees:
        libCall = spv::GLSLstd450Degrees;
        break;
    case glslang::EOpSin:
        libCall = spv::GLSLstd450Sin;
        break;
    case glslang::EOpCos:
        libCall = spv::GLSLstd450Cos;
        break;
    case glslang::EOpTan:
        libCall = spv::GLSLstd450Tan;
        break;
    case glslang::EOpAcos:
        libCall = spv::GLSLstd450Acos;
        break;
    case glslang::EOpAsin:
        libCall = spv::GLSLstd450Asin;
        break;
    case glslang::EOpAtan:
        libCall = spv::GLSLstd450Atan;
        break;

    case glslang::EOpAcosh:
        libCall = spv::GLSLstd450Acosh;
        break;
    case glslang::EOpAsinh:
        libCall = spv::GLSLstd450Asinh;
        break;
    case glslang::EOpAtanh:
        libCall = spv::GLSLstd450Atanh;
        break;
    case glslang::EOpTanh:
        libCall = spv::GLSLstd450Tanh;
        break;
    case glslang::EOpCosh:
        libCall = spv::GLSLstd450Cosh;
        break;
    case glslang::EOpSinh:
        libCall = spv::GLSLstd450Sinh;
        break;

    case glslang::EOpLength:
        libCall = spv::GLSLstd450Length;
        break;
    case glslang::EOpNormalize:
        libCall = spv::GLSLstd450Normalize;
        break;

    case glslang::EOpExp:
        libCall = spv::GLSLstd450Exp;
        break;
    case glslang::EOpLog:
        libCall = spv::GLSLstd450Log;
        break;
    case glslang::EOpExp2:
        libCall = spv::GLSLstd450Exp2;
        break;
    case glslang::EOpLog2:
        libCall = spv::GLSLstd450Log2;
        break;
    case glslang::EOpSqrt:
        libCall = spv::GLSLstd450Sqrt;
        break;
    case glslang::EOpInverseSqrt:
        libCall = spv::GLSLstd450InverseSqrt;
        break;

    case glslang::EOpFloor:
        libCall = spv::GLSLstd450Floor;
        break;
    case glslang::EOpTrunc:
        libCall = spv::GLSLstd450Trunc;
        break;
    case glslang::EOpRound:
        libCall = spv::GLSLstd450Round;
        break;
    case glslang::EOpRoundEven:
        libCall = spv::GLSLstd450RoundEven;
        break;
    case glslang::EOpCeil:
        libCall = spv::GLSLstd450Ceil;
        break;
    case glslang::EOpFract:
        libCall = spv::GLSLstd450Fract;
        break;

    case glslang::EOpIsNan:
        unaryOp = spv::OpIsNan;
        break;
    case glslang::EOpIsInf:
        unaryOp = spv::OpIsInf;
        break;
    case glslang::EOpIsFinite:
        unaryOp = spv::OpIsFinite;
        break;

    case glslang::EOpFloatBitsToInt:
    case glslang::EOpFloatBitsToUint:
    case glslang::EOpIntBitsToFloat:
    case glslang::EOpUintBitsToFloat:
    case glslang::EOpDoubleBitsToInt64:
    case glslang::EOpDoubleBitsToUint64:
    case glslang::EOpInt64BitsToDouble:
    case glslang::EOpUint64BitsToDouble:
    case glslang::EOpFloat16BitsToInt16:
    case glslang::EOpFloat16BitsToUint16:
    case glslang::EOpInt16BitsToFloat16:
    case glslang::EOpUint16BitsToFloat16:
        unaryOp = spv::OpBitcast;
        break;

    case glslang::EOpPackSnorm2x16:
        libCall = spv::GLSLstd450PackSnorm2x16;
        break;
    case glslang::EOpUnpackSnorm2x16:
        libCall = spv::GLSLstd450UnpackSnorm2x16;
        break;
    case glslang::EOpPackUnorm2x16:
        libCall = spv::GLSLstd450PackUnorm2x16;
        break;
    case glslang::EOpUnpackUnorm2x16:
        libCall = spv::GLSLstd450UnpackUnorm2x16;
        break;
    case glslang::EOpPackHalf2x16:
        libCall = spv::GLSLstd450PackHalf2x16;
        break;
    case glslang::EOpUnpackHalf2x16:
        libCall = spv::GLSLstd450UnpackHalf2x16;
        break;
    case glslang::EOpPackSnorm4x8:
        libCall = spv::GLSLstd450PackSnorm4x8;
        break;
    case glslang::EOpUnpackSnorm4x8:
        libCall = spv::GLSLstd450UnpackSnorm4x8;
        break;
    case glslang::EOpPackUnorm4x8:
        libCall = spv::GLSLstd450PackUnorm4x8;
        break;
    case glslang::EOpUnpackUnorm4x8:
        libCall = spv::GLSLstd450UnpackUnorm4x8;
        break;
    case glslang::EOpPackDouble2x32:
        libCall = spv::GLSLstd450PackDouble2x32;
        break;
    case glslang::EOpUnpackDouble2x32:
        libCall = spv::GLSLstd450UnpackDouble2x32;
        break;

    case glslang::EOpPackInt2x32:
    case glslang::EOpUnpackInt2x32:
    case glslang::EOpPackUint2x32:
    case glslang::EOpUnpackUint2x32:
    case glslang::EOpPack16:
    case glslang::EOpPack32:
    case glslang::EOpPack64:
    case glslang::EOpUnpack32:
    case glslang::EOpUnpack16:
    case glslang::EOpUnpack8:
    case glslang::EOpPackInt2x16:
    case glslang::EOpUnpackInt2x16:
    case glslang::EOpPackUint2x16:
    case glslang::EOpUnpackUint2x16:
    case glslang::EOpPackInt4x16:
    case glslang::EOpUnpackInt4x16:
    case glslang::EOpPackUint4x16:
    case glslang::EOpUnpackUint4x16:
    case glslang::EOpPackFloat2x16:
    case glslang::EOpUnpackFloat2x16:
        unaryOp = spv::OpBitcast;
        break;

    case glslang::EOpDPdx:
        unaryOp = spv::OpDPdx;
        break;
    case glslang::EOpDPdy:
        unaryOp = spv::OpDPdy;
        break;
    case glslang::EOpFwidth:
        unaryOp = spv::OpFwidth;
        break;

    case glslang::EOpAny:
        unaryOp = spv::OpAny;
        break;
    case glslang::EOpAll:
        unaryOp = spv::OpAll;
        break;

    case glslang::EOpAbs:
        if (isFloat)
            libCall = spv::GLSLstd450FAbs;
        else
            libCall = spv::GLSLstd450SAbs;
        break;
    case glslang::EOpSign:
        if (isFloat)
            libCall = spv::GLSLstd450FSign;
        else
            libCall = spv::GLSLstd450SSign;
        break;

    case glslang::EOpDPdxFine:
        unaryOp = spv::OpDPdxFine;
        break;
    case glslang::EOpDPdyFine:
        unaryOp = spv::OpDPdyFine;
        break;
    case glslang::EOpFwidthFine:
        unaryOp = spv::OpFwidthFine;
        break;
    case glslang::EOpDPdxCoarse:
        unaryOp = spv::OpDPdxCoarse;
        break;
    case glslang::EOpDPdyCoarse:
        unaryOp = spv::OpDPdyCoarse;
        break;
    case glslang::EOpFwidthCoarse:
        unaryOp = spv::OpFwidthCoarse;
        break;
    case glslang::EOpRayQueryProceed:
        unaryOp = spv::OpRayQueryProceedKHR;
        break;
    case glslang::EOpRayQueryGetRayTMin:
        unaryOp = spv::OpRayQueryGetRayTMinKHR;
        break;
    case glslang::EOpRayQueryGetRayFlags:
        unaryOp = spv::OpRayQueryGetRayFlagsKHR;
        break;
    case glslang::EOpRayQueryGetWorldRayOrigin:
        unaryOp = spv::OpRayQueryGetWorldRayOriginKHR;
        break;
    case glslang::EOpRayQueryGetWorldRayDirection:
        unaryOp = spv::OpRayQueryGetWorldRayDirectionKHR;
        break;
    case glslang::EOpRayQueryGetIntersectionCandidateAABBOpaque:
        unaryOp = spv::OpRayQueryGetIntersectionCandidateAABBOpaqueKHR;
        break;
    case glslang::EOpInterpolateAtCentroid:
        if (typeProxy == glslang::EbtFloat16)
            builder.addExtension(spv::E_SPV_AMD_gpu_shader_half_float);
        libCall = spv::GLSLstd450InterpolateAtCentroid;
        break;
    case glslang::EOpAtomicCounterIncrement:
    case glslang::EOpAtomicCounterDecrement:
    case glslang::EOpAtomicCounter:
    {
        // Handle all of the atomics in one place, in createAtomicOperation()
        std::vector<spv::Id> operands;
        operands.push_back(operand);
        return createAtomicOperation(op, decorations.precision, typeId, operands, typeProxy, lvalueCoherentFlags, opType);
    }

    case glslang::EOpBitFieldReverse:
        unaryOp = spv::OpBitReverse;
        break;
    case glslang::EOpBitCount:
        unaryOp = spv::OpBitCount;
        break;
    case glslang::EOpFindLSB:
        libCall = spv::GLSLstd450FindILsb;
        break;
    case glslang::EOpFindMSB:
        if (isUnsigned)
            libCall = spv::GLSLstd450FindUMsb;
        else
            libCall = spv::GLSLstd450FindSMsb;
        break;

    case glslang::EOpCountLeadingZeros:
        builder.addCapability(spv::CapabilityIntegerFunctions2INTEL);
        builder.addExtension("SPV_INTEL_shader_integer_functions2");
        unaryOp = spv::OpUCountLeadingZerosINTEL;
        break;

    case glslang::EOpCountTrailingZeros:
        builder.addCapability(spv::CapabilityIntegerFunctions2INTEL);
        builder.addExtension("SPV_INTEL_shader_integer_functions2");
        unaryOp = spv::OpUCountTrailingZerosINTEL;
        break;

    case glslang::EOpBallot:
    case glslang::EOpReadFirstInvocation:
    case glslang::EOpAnyInvocation:
    case glslang::EOpAllInvocations:
    case glslang::EOpAllInvocationsEqual:
    case glslang::EOpMinInvocations:
    case glslang::EOpMaxInvocations:
    case glslang::EOpAddInvocations:
    case glslang::EOpMinInvocationsNonUniform:
    case glslang::EOpMaxInvocationsNonUniform:
    case glslang::EOpAddInvocationsNonUniform:
    case glslang::EOpMinInvocationsInclusiveScan:
    case glslang::EOpMaxInvocationsInclusiveScan:
    case glslang::EOpAddInvocationsInclusiveScan:
    case glslang::EOpMinInvocationsInclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
    case glslang::EOpAddInvocationsInclusiveScanNonUniform:
    case glslang::EOpMinInvocationsExclusiveScan:
    case glslang::EOpMaxInvocationsExclusiveScan:
    case glslang::EOpAddInvocationsExclusiveScan:
    case glslang::EOpMinInvocationsExclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
    case glslang::EOpAddInvocationsExclusiveScanNonUniform:
    {
        std::vector<spv::Id> operands;
        operands.push_back(operand);
        return createInvocationsOperation(op, typeId, operands, typeProxy);
    }
    case glslang::EOpSubgroupAll:
    case glslang::EOpSubgroupAny:
    case glslang::EOpSubgroupAllEqual:
    case glslang::EOpSubgroupBroadcastFirst:
    case glslang::EOpSubgroupBallot:
    case glslang::EOpSubgroupInverseBallot:
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupBallotFindLSB:
    case glslang::EOpSubgroupBallotFindMSB:
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:
    case glslang::EOpSubgroupQuadAll:
    case glslang::EOpSubgroupQuadAny: {
        std::vector<spv::Id> operands;
        operands.push_back(operand);
        return createSubgroupOperation(op, typeId, operands, typeProxy);
    }
    case glslang::EOpMbcnt:
        extBuiltins = getExtBuiltins(spv::E_SPV_AMD_shader_ballot);
        libCall = spv::MbcntAMD;
        break;

    case glslang::EOpCubeFaceIndex:
        extBuiltins = getExtBuiltins(spv::E_SPV_AMD_gcn_shader);
        libCall = spv::CubeFaceIndexAMD;
        break;

    case glslang::EOpCubeFaceCoord:
        extBuiltins = getExtBuiltins(spv::E_SPV_AMD_gcn_shader);
        libCall = spv::CubeFaceCoordAMD;
        break;
    case glslang::EOpSubgroupPartition:
        unaryOp = spv::OpGroupNonUniformPartitionNV;
        break;
    case glslang::EOpConstructReference:
        unaryOp = spv::OpBitcast;
        break;

    case glslang::EOpConvUint64ToAccStruct:
    case glslang::EOpConvUvec2ToAccStruct:
        unaryOp = spv::OpConvertUToAccelerationStructureKHR;
        break;

    case glslang::EOpHitObjectIsEmptyNV:
        unaryOp = spv::OpHitObjectIsEmptyNV;
        break;

    case glslang::EOpHitObjectIsMissNV:
        unaryOp = spv::OpHitObjectIsMissNV;
        break;

    case glslang::EOpHitObjectIsHitNV:
        unaryOp = spv::OpHitObjectIsHitNV;
        break;

    case glslang::EOpHitObjectGetObjectRayOriginNV:
        unaryOp = spv::OpHitObjectGetObjectRayOriginNV;
        break;

    case glslang::EOpHitObjectGetObjectRayDirectionNV:
        unaryOp = spv::OpHitObjectGetObjectRayDirectionNV;
        break;

    case glslang::EOpHitObjectGetWorldRayOriginNV:
        unaryOp = spv::OpHitObjectGetWorldRayOriginNV;
        break;

    case glslang::EOpHitObjectGetWorldRayDirectionNV:
        unaryOp = spv::OpHitObjectGetWorldRayDirectionNV;
        break;

    case glslang::EOpHitObjectGetObjectToWorldNV:
        unaryOp = spv::OpHitObjectGetObjectToWorldNV;
        break;

    case glslang::EOpHitObjectGetWorldToObjectNV:
        unaryOp = spv::OpHitObjectGetWorldToObjectNV;
        break;

    case glslang::EOpHitObjectGetRayTMinNV:
        unaryOp = spv::OpHitObjectGetRayTMinNV;
        break;

    case glslang::EOpHitObjectGetRayTMaxNV:
        unaryOp = spv::OpHitObjectGetRayTMaxNV;
        break;

    case glslang::EOpHitObjectGetPrimitiveIndexNV:
        unaryOp = spv::OpHitObjectGetPrimitiveIndexNV;
        break;

    case glslang::EOpHitObjectGetInstanceIdNV:
        unaryOp = spv::OpHitObjectGetInstanceIdNV;
        break;

    case glslang::EOpHitObjectGetInstanceCustomIndexNV:
        unaryOp = spv::OpHitObjectGetInstanceCustomIndexNV;
        break;

    case glslang::EOpHitObjectGetGeometryIndexNV:
        unaryOp = spv::OpHitObjectGetGeometryIndexNV;
        break;

    case glslang::EOpHitObjectGetHitKindNV:
        unaryOp = spv::OpHitObjectGetHitKindNV;
        break;

    case glslang::EOpHitObjectGetCurrentTimeNV:
        unaryOp = spv::OpHitObjectGetCurrentTimeNV;
        break;

    case glslang::EOpHitObjectGetShaderBindingTableRecordIndexNV:
        unaryOp = spv::OpHitObjectGetShaderBindingTableRecordIndexNV;
        break;

    case glslang::EOpHitObjectGetShaderRecordBufferHandleNV:
        unaryOp = spv::OpHitObjectGetShaderRecordBufferHandleNV;
        break;

    case glslang::EOpHitObjectGetClusterIdNV:
        unaryOp = spv::OpHitObjectGetClusterIdNV;
        builder.addExtension(spv::E_SPV_NV_cluster_acceleration_structure);
        builder.addCapability(spv::CapabilityShaderInvocationReorderNV);
        builder.addCapability(spv::CapabilityRayTracingClusterAccelerationStructureNV);
        break;

    case glslang::EOpHitObjectGetSpherePositionNV:
        unaryOp = spv::OpHitObjectGetSpherePositionNV;
        break;

    case glslang::EOpHitObjectGetSphereRadiusNV:
        unaryOp = spv::OpHitObjectGetSphereRadiusNV;
        break;

    case glslang::EOpHitObjectIsSphereHitNV:
        unaryOp = spv::OpHitObjectIsSphereHitNV;
        break;

    case glslang::EOpHitObjectIsLSSHitNV:
        unaryOp = spv::OpHitObjectIsLSSHitNV;
        break;

    case glslang::EOpFetchMicroTriangleVertexPositionNV:
        unaryOp = spv::OpFetchMicroTriangleVertexPositionNV;
        break;

    case glslang::EOpFetchMicroTriangleVertexBarycentricNV:
        unaryOp = spv::OpFetchMicroTriangleVertexBarycentricNV;
        break;

    case glslang::EOpCopyObject:
        unaryOp = spv::OpCopyObject;
        break;

    case glslang::EOpDepthAttachmentReadEXT:
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);
        builder.addCapability(spv::CapabilityTileImageDepthReadAccessEXT);
        unaryOp = spv::OpDepthAttachmentReadEXT;
        decorations.precision = spv::NoPrecision;
        break;
    case glslang::EOpStencilAttachmentReadEXT:
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);
        builder.addCapability(spv::CapabilityTileImageStencilReadAccessEXT);
        unaryOp = spv::OpStencilAttachmentReadEXT;
        decorations.precision = spv::DecorationRelaxedPrecision;
        break;

    default:
        return 0;
    }

    spv::Id id;
    if (libCall >= 0) {
        std::vector<spv::Id> args;
        args.push_back(operand);
        id = builder.createBuiltinCall(typeId, extBuiltins >= 0 ? extBuiltins : stdBuiltins, libCall, args);
    } else {
        id = builder.createUnaryOp(unaryOp, typeId, operand);
    }

    decorations.addNoContraction(builder, id);
    decorations.addNonUniform(builder, id);
    return builder.setPrecision(id, decorations.precision);
}